

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popt.c
# Opt level: O0

int poptAddItem(poptContext con,poptItem newItem,int flags)

{
  char *pcVar1;
  size_t sVar2;
  char *pcVar3;
  char *local_80;
  char *local_70;
  char *local_60;
  int *local_48;
  int *nitems;
  poptItem item;
  poptItem item_tmp;
  poptItem *items;
  int flags_local;
  poptItem newItem_local;
  poptContext con_local;
  
  if (flags == 0) {
    item_tmp = (poptItem)&con->aliases;
    local_48 = &con->numAliases;
  }
  else {
    if (flags != 1) {
      return 1;
    }
    item_tmp = (poptItem)&con->execs;
    local_48 = &con->numExecs;
  }
  pcVar1 = (char *)realloc((item_tmp->option).longName,(long)(*local_48 + 1) << 6);
  if (pcVar1 == (char *)0x0) {
    con_local._4_4_ = 1;
  }
  else {
    (item_tmp->option).longName = pcVar1;
    pcVar1 = (item_tmp->option).longName + (long)*local_48 * 0x40;
    if ((newItem->option).longName == (char *)0x0) {
      local_60 = (char *)0x0;
    }
    else {
      sVar2 = strlen((newItem->option).longName);
      pcVar3 = (char *)malloc(sVar2 + 1);
      if (pcVar3 == (char *)0x0) {
        fprintf(_stderr,"virtual memory exhausted.\n");
        exit(1);
      }
      local_60 = strcpy(pcVar3,(newItem->option).longName);
    }
    *(char **)pcVar1 = local_60;
    pcVar1[8] = (newItem->option).shortName;
    *(uint *)(pcVar1 + 0xc) = (newItem->option).argInfo;
    *(void **)(pcVar1 + 0x10) = (newItem->option).arg;
    *(int *)(pcVar1 + 0x18) = (newItem->option).val;
    if ((newItem->option).descrip == (char *)0x0) {
      local_70 = (char *)0x0;
    }
    else {
      sVar2 = strlen((newItem->option).descrip);
      pcVar3 = (char *)malloc(sVar2 + 1);
      if (pcVar3 == (char *)0x0) {
        fprintf(_stderr,"virtual memory exhausted.\n");
        exit(1);
      }
      local_70 = strcpy(pcVar3,(newItem->option).descrip);
    }
    *(char **)(pcVar1 + 0x20) = local_70;
    if ((newItem->option).argDescrip == (char *)0x0) {
      local_80 = (char *)0x0;
    }
    else {
      sVar2 = strlen((newItem->option).argDescrip);
      pcVar3 = (char *)malloc(sVar2 + 1);
      if (pcVar3 == (char *)0x0) {
        fprintf(_stderr,"virtual memory exhausted.\n");
        exit(1);
      }
      local_80 = strcpy(pcVar3,(newItem->option).argDescrip);
    }
    *(char **)(pcVar1 + 0x28) = local_80;
    *(int *)(pcVar1 + 0x30) = newItem->argc;
    *(char ***)(pcVar1 + 0x38) = newItem->argv;
    *local_48 = *local_48 + 1;
    con_local._4_4_ = 0;
  }
  return con_local._4_4_;
}

Assistant:

int poptAddItem(poptContext con, poptItem newItem, int flags)
{
    poptItem * items, item_tmp, item;
    int * nitems;

    switch (flags) {
    case 1:
	items = &con->execs;
	nitems = &con->numExecs;
	break;
    case 0:
	items = &con->aliases;
	nitems = &con->numAliases;
	break;
    default:
	return 1;
	break;
    }

    item_tmp = realloc((*items), ((*nitems) + 1) * sizeof(**items));
    if (item_tmp == NULL)
	return 1;
    *items = item_tmp;

    item = (*items) + (*nitems);

    item->option.longName =
	(newItem->option.longName ? xstrdup(newItem->option.longName) : NULL);
    item->option.shortName = newItem->option.shortName;
    item->option.argInfo = newItem->option.argInfo;
    item->option.arg = newItem->option.arg;
    item->option.val = newItem->option.val;
    item->option.descrip =
	(newItem->option.descrip ? xstrdup(newItem->option.descrip) : NULL);
    item->option.argDescrip =
       (newItem->option.argDescrip ? xstrdup(newItem->option.argDescrip) : NULL);
    item->argc = newItem->argc;
    item->argv = newItem->argv;

    (*nitems)++;

    return 0;
}